

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowsReporters.cpp
# Opt level: O0

void __thiscall ApprovalTests::Windows::KDiff3Reporter::KDiff3Reporter(KDiff3Reporter *this)

{
  DiffInfo *in_RDI;
  DiffInfo *in_stack_ffffffffffffffd8;
  GenericDiffReporter *in_stack_ffffffffffffffe0;
  
  DiffPrograms::Windows::KDIFF3();
  GenericDiffReporter::GenericDiffReporter(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  DiffInfo::~DiffInfo(in_RDI);
  *(undefined ***)&in_RDI->program = &PTR__KDiff3Reporter_00281208;
  return;
}

Assistant:

KDiff3Reporter::KDiff3Reporter()
            : GenericDiffReporter(DiffPrograms::Windows::KDIFF3())
        {
        }